

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O2

ostream * pstore::operator<<(ostream *stream,uuid *m)

{
  ostream *poVar1;
  string local_30;
  
  uuid::str_abi_cxx11_(&local_30,m);
  poVar1 = std::operator<<(stream,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & stream, uuid const & m) { return stream << m.str (); }